

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makePointer(TranslateToFuzzReader *this)

{
  Builder *this_00;
  address64_t aVar1;
  uint32_t uVar2;
  Expression *pEVar3;
  Const *pCVar4;
  Expression *pEVar5;
  undefined4 uVar6;
  
  pEVar3 = make(this,(Type)*(uintptr_t *)
                            ((long)(((this->wasm->memories).
                                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                            + 0x50));
  if ((this->allowOOB == true) && (uVar2 = Random::upTo(&this->random,10), uVar2 == 0)) {
    return pEVar3;
  }
  this_00 = &this->builder;
  aVar1 = (this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr;
  if (*(long *)((long)(((this->wasm->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x50
               ) == 3) {
    pCVar4 = Builder::makeConst<long>(this_00,aVar1 - 1);
    uVar6 = 0x20;
  }
  else {
    pCVar4 = Builder::makeConst<int>(this_00,(int)aVar1 + -1);
    uVar6 = 7;
  }
  pEVar5 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x28,8);
  pEVar5->_id = BinaryId;
  (pEVar5->type).id = 0;
  *(undefined4 *)(pEVar5 + 1) = uVar6;
  pEVar5[1].type.id = (uintptr_t)pEVar3;
  *(Const **)(pEVar5 + 2) = pCVar4;
  ::wasm::Binary::finalize();
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makePointer() {
  auto* ret = make(wasm.memories[0]->addressType);
  // with high probability, mask the pointer so it's in a reasonable
  // range. otherwise, most pointers are going to be out of range and
  // most memory ops will just trap
  if (!allowOOB || !oneIn(10)) {
    if (wasm.memories[0]->is64()) {
      ret = builder.makeBinary(
        AndInt64,
        ret,
        builder.makeConst(int64_t(fuzzParams->USABLE_MEMORY - 1)));
    } else {
      ret = builder.makeBinary(
        AndInt32,
        ret,
        builder.makeConst(int32_t(fuzzParams->USABLE_MEMORY - 1)));
    }
  }
  return ret;
}